

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  long *plVar2;
  string test;
  model ftrl;
  dataset xtest;
  model ftrl2;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  model local_158;
  dataset local_e8;
  model local_88;
  
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "0 3:1 6:1 17:1 27:1 35:1 40:1 57:1 63:1 69:1 73:1 74:1 76:1 81:1 103:1","");
  dataset::dataset(&local_e8,&local_178);
  model::model(&local_158,0x7b,10.0,0.0,0.0,1.0);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,anon_var_dwarf_131e8,anon_var_dwarf_131e8 + 0x48);
  model::fit(&local_158,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,anon_var_dwarf_131fe,anon_var_dwarf_131fe + 0x44);
  model::save_model(&local_158,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,anon_var_dwarf_131fe,anon_var_dwarf_131fe + 0x44);
  model::model(&local_88,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  iVar1 = model::predict(&local_158,&local_e8,0.5);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  iVar1 = model::predict(&local_88,&local_e8,0.5);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  model::~model(&local_88);
  model::~model(&local_158);
  dataset::~dataset(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main() {
    string test = "0 3:1 6:1 17:1 27:1 35:1 40:1 57:1 63:1 69:1 73:1 74:1 76:1 81:1 103:1";
    dataset xtest(test);
    model ftrl(123, 10, 0, 0, 1);
    ftrl.fit("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/Traindata.ftrl");
    ftrl.save_model("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/model.ftrl");
    model ftrl2("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/model.ftrl");
    cout << ftrl.predict(&xtest) << endl;
    cout << ftrl2.predict(&xtest) << endl;
    return 0;
}